

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::preprocessingInitital(CScanner *this,char c)

{
  CDirectiveParser *pCVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  if (iVar2 < 0x2b) {
    if (iVar2 == 0x27) {
      processing(this,'\0');
      iVar2 = this->position;
      pCVar1 = &(this->super_CParser).super_CDirectiveParser;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.line = this->line;
      (pCVar1->super_CRuleParser).super_CQualifierParser.token.position = iVar2;
      (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.
      word._M_string_length = 0;
      *(this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.
       word._M_dataplus._M_p = '\0';
      this->preprocessingState = PS_String;
    }
    else {
      if (iVar2 != 0x2a) goto LAB_00131322;
      processing(this,'\0');
      this->preprocessingState = PS_SingleLineComment;
      this->savedPreprocessingState = PS_Initial;
    }
  }
  else {
    if (iVar2 != 0x2b) {
      if (iVar2 == 0x3b) {
        warning(this,W_Semicolon,';');
        c = '\n';
      }
      else if (iVar2 == 0x7b) {
        processing(this,'\0');
        this->preprocessingState = PS_MultilineComment;
        this->savedPreprocessingState = PS_Initial;
        return;
      }
LAB_00131322:
      processing(this,c);
      return;
    }
    processing(this,'\0');
    this->preprocessingState = PS_Plus;
  }
  return;
}

Assistant:

void CScanner::preprocessingInitital( char c )
{
	switch( c ) {
		case Quote:
			processing( UniversalSeparatorOfTokens );
			setLineAndPositionOfToken();
			token.word.clear();
			preprocessingState = PS_String;
			break;
		case Plus:
			processing( UniversalSeparatorOfTokens );
			preprocessingState = PS_Plus;
			break;
		case SingleLineCommentBegin:
			processing( UniversalSeparatorOfTokens );
			savedPreprocessingState = PS_Initial;
			preprocessingState = PS_SingleLineComment;
			break;
		case MultilineCommentBegin:
			processing( UniversalSeparatorOfTokens );
			savedPreprocessingState = PS_Initial;
			preprocessingState = PS_MultilineComment;
			break;
		case Semicolon:
			warning( W_Semicolon, c );
			processing( LineFeed );
			break;
		default:
			processing( c );
			break;
	}
}